

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Customer.cpp
# Opt level: O2

string * __thiscall
CheapCustomer::toString_abi_cxx11_(string *__return_storage_ptr__,CheapCustomer *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)&(this->super_Customer).name);
  std::operator+(__return_storage_ptr__,&local_30,",chp ");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string CheapCustomer::toString() const {return getName() + ",chp ";}